

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

int deqp::gles31::Functional::anon_unknown_0::getVarTypeSize(VarType *type)

{
  Type TVar1;
  int iVar2;
  DataType DVar3;
  int iVar4;
  pointer pSVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  iVar4 = 1;
  while (TVar1 = type->m_type, TVar1 == TYPE_ARRAY) {
    iVar8 = (type->m_data).array.size;
    type = (type->m_data).array.elementType;
    if (iVar8 == -1) {
      iVar8 = 1;
    }
    iVar4 = iVar4 * iVar8;
  }
  if (TVar1 == TYPE_BASIC) {
    iVar8 = glu::getDataTypeScalarSize((type->m_data).basic.type);
    DVar3 = glu::getDataTypeScalarType((type->m_data).basic.type);
    iVar8 = (uint)((DVar3 == TYPE_BOOL || DVar3 == TYPE_FLOAT) ||
                  (DVar3 & ~TYPE_FLOAT_VEC4) == TYPE_INT) * iVar8 * 4;
  }
  else if ((TVar1 == TYPE_STRUCT) &&
          (pSVar5 = (((type->m_data).structPtr)->m_members).
                    super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          0 < (int)((ulong)((long)(((type->m_data).structPtr)->m_members).
                                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5) >> 3) *
              -0x49249249)) {
    lVar6 = 0;
    lVar7 = 0x20;
    iVar8 = 0;
    do {
      iVar2 = getVarTypeSize((VarType *)((long)&(pSVar5->m_name)._M_dataplus._M_p + lVar7));
      iVar8 = iVar8 + iVar2;
      lVar6 = lVar6 + 1;
      pSVar5 = (((type->m_data).structPtr)->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x38;
    } while (lVar6 < (int)((ulong)((long)(((type->m_data).structPtr)->m_members).
                                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5)
                          >> 3) * -0x49249249);
  }
  else {
    iVar8 = 0;
  }
  return iVar4 * iVar8;
}

Assistant:

static int getVarTypeSize (const glu::VarType& type)
{
	if (type.isBasicType())
	{
		// return in basic machine units
		return glu::getDataTypeScalarSize(type.getBasicType()) * getTypeSize(glu::getDataTypeScalarType(type.getBasicType()));
	}
	else if (type.isStructType())
	{
		int size = 0;
		for (int ndx = 0; ndx < type.getStructPtr()->getNumMembers(); ++ndx)
			size += getVarTypeSize(type.getStructPtr()->getMember(ndx).getType());
		return size;
	}
	else if (type.isArrayType())
	{
		// unsized arrays are handled as if they had only one element
		if (type.getArraySize() == glu::VarType::UNSIZED_ARRAY)
			return getVarTypeSize(type.getElementType());
		else
			return type.getArraySize() * getVarTypeSize(type.getElementType());
	}
	else
	{
		DE_ASSERT(false);
		return 0;
	}
}